

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

bool __thiscall TSMuxer::isSplitPoint(TSMuxer *this,AVPacket *avPacket)

{
  if ((avPacket->stream_index == this->m_mainStreamIndex) && ((avPacket->flags & 8) != 0)) {
    if (this->m_splitSize != 0) {
      return this->m_splitSize <
             this->m_frameSize *
             (this->m_muxedPacketCnt).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    }
    if (0 < this->m_splitDuration) {
      return this->m_splitDuration < avPacket->pts - this->m_curFileStartPts;
    }
  }
  return false;
}

Assistant:

bool TSMuxer::isSplitPoint(const AVPacket& avPacket) const
{
    if (avPacket.stream_index != m_mainStreamIndex || !(avPacket.flags & AVPacket::IS_IFRAME))
        return false;

    if (m_splitSize > 0)
    {
        return m_muxedPacketCnt[m_muxedPacketCnt.size() - 1] * m_frameSize > m_splitSize;
    }
    if (m_splitDuration > 0)
    {
        return (avPacket.pts - m_curFileStartPts) > m_splitDuration;
    }

    return false;
}